

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O3

bool vk::isShaderStageSupported
               (VkPhysicalDeviceFeatures *deviceFeatures,VkShaderStageFlagBits stage)

{
  VkBool32 VVar1;
  
  if (stage != VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
    if (stage == VK_SHADER_STAGE_GEOMETRY_BIT) {
      VVar1 = deviceFeatures->geometryShader;
      goto LAB_00a09620;
    }
    if (stage != VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      return true;
    }
  }
  VVar1 = deviceFeatures->tessellationShader;
LAB_00a09620:
  return VVar1 == 1;
}

Assistant:

bool isShaderStageSupported (const VkPhysicalDeviceFeatures& deviceFeatures, VkShaderStageFlagBits stage)
{
	if (stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT || stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		return deviceFeatures.tessellationShader == VK_TRUE;
	else if (stage == VK_SHADER_STAGE_GEOMETRY_BIT)
		return deviceFeatures.geometryShader == VK_TRUE;
	else
		return true;
}